

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void Omega_h::find_matches_deg<2,long>
               (LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  char *file;
  int size_in;
  undefined1 local_248 [8];
  type f;
  string local_1b8 [32];
  undefined1 local_198 [8];
  Write<signed_char> codes;
  string local_180 [32];
  undefined1 local_160 [8];
  Write<int> a2b;
  Read<signed_char> vb_codes;
  LOs vb2b;
  LOs v2vb;
  __cxx11 local_118 [4];
  LO na;
  allocator local_e1;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [38];
  ScopedTimer local_7a;
  byte local_79;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> *pWStack_78;
  bool allow_duplicates_local;
  Write<signed_char> *codes_out_local;
  Write<int> *a2b_out_local;
  Adj *v2b_local;
  Read<int> *bv2v_local;
  Read<int> *av2v_local;
  LOs *a2fv_local;
  ulong local_30;
  ulong local_10;
  
  local_79 = allow_duplicates;
  pWStack_78 = codes_out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_e1);
  std::operator+(local_c0,(char *)local_e0);
  std::__cxx11::to_string(local_118,0x169);
  std::operator+(local_a0,local_c0);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_7a,"find_matches_deg",file);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (((ulong)(a2fv->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((a2fv->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(a2fv->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (int)(local_30 >> 2);
  if (((ulong)(av2v->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((av2v->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(av2v->write_).shared_alloc_.alloc >> 3;
  }
  if (size_in << 1 == (int)(local_10 >> 3)) {
    Read<int>::Read((Read<int> *)&vb2b.write_.shared_alloc_.direct_ptr,(Read<int> *)v2b);
    Read<int>::Read((Read<int> *)&vb_codes.write_.shared_alloc_.direct_ptr,&(v2b->super_Graph).ab2b)
    ;
    Read<signed_char>::Read((Read<signed_char> *)&a2b.shared_alloc_.direct_ptr,&v2b->codes);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_180,"",(allocator *)((long)&codes.shared_alloc_.direct_ptr + 7));
    Write<int>::Write((Write<int> *)local_160,size_in,(string *)local_180);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)((long)&codes.shared_alloc_.direct_ptr + 7))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"",(allocator *)&f.field_0x87);
    Write<signed_char>::Write((Write<signed_char> *)local_198,size_in,(string *)local_1b8);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&f.field_0x87);
    Read<int>::Read((Read<int> *)local_248,a2fv);
    Read<int>::Read((Read<int> *)&f.a2fv.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&vb2b.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.v2vb.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&vb_codes.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.vb2b.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&a2b.shared_alloc_.direct_ptr);
    Read<long>::Read((Read<long> *)&f.vb_codes.write_.shared_alloc_.direct_ptr,av2v);
    Read<long>::Read((Read<long> *)&f.av2v.write_.shared_alloc_.direct_ptr,bv2v);
    Write<int>::Write((Write<int> *)&f.bv2v.write_.shared_alloc_.direct_ptr,(Write<int> *)local_160)
    ;
    Write<signed_char>::Write
              ((Write<signed_char> *)&f.a2b.shared_alloc_.direct_ptr,(Write<signed_char> *)local_198
              );
    f.codes.shared_alloc_.direct_ptr._0_1_ = local_79 & 1;
    parallel_for<Omega_h::find_matches_deg<2,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)::_lambda(int)_1_>
              (size_in,(type *)local_248);
    Write<int>::operator=(a2b_out,(Write<int> *)local_160);
    Write<signed_char>::operator=(pWStack_78,(Write<signed_char> *)local_198);
    find_matches_deg<2,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)local_248);
    Write<signed_char>::~Write((Write<signed_char> *)local_198);
    Write<int>::~Write((Write<int> *)local_160);
    Read<signed_char>::~Read((Read<signed_char> *)&a2b.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&vb_codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&vb2b.write_.shared_alloc_.direct_ptr);
    ScopedTimer::~ScopedTimer(&local_7a);
    return;
  }
  fail("assertion %s failed at %s +%d\n","na * deg == av2v.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
       ,0x16b);
}

Assistant:

void find_matches_deg(LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  OMEGA_H_TIME_FUNCTION;
  LO const na = a2fv.size();
  OMEGA_H_CHECK(na * deg == av2v.size());
  LOs const v2vb = v2b.a2ab;
  LOs const vb2b = v2b.ab2b;
  Read<I8> const vb_codes = v2b.codes;
  Write<LO> a2b(na);
  Write<I8> codes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto const fv = a2fv[a];
    auto const a_begin = a * deg;
    auto const vb_begin = v2vb[fv];
    auto const vb_end = v2vb[fv + 1];
    bool found = false;
    for (LO vb = vb_begin; vb < vb_end; ++vb) {
      auto const b = vb2b[vb];
      auto const vb_code = vb_codes[vb];
      auto const which_down = code_which_down(vb_code);
      auto const b_begin = b * deg;
      I8 match_code;
      if (IsMatch<deg>::eval(
              av2v, a_begin, bv2v, b_begin, which_down, &match_code)) {
        OMEGA_H_CHECK(!found);  // there can't be more than one!
        a2b[a] = b;
        codes[a] = match_code;
        found = true;
        if (allow_duplicates) break;
      }
    }
    (void)found;
    OMEGA_H_CHECK(found);  // there can't be less than one!
  };
  parallel_for(na, std::move(f));
  *a2b_out = a2b;
  *codes_out = codes;
}